

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall
google::protobuf::UnknownField::SerializeLengthDelimitedNoTag
          (UnknownField *this,CodedOutputStream *output)

{
  CodedOutputStream *pCVar1;
  Type TVar2;
  uint32 value;
  int size;
  LogMessage *other;
  void *data_00;
  string *data;
  byte local_51;
  LogMessage local_50;
  CodedOutputStream *local_18;
  CodedOutputStream *output_local;
  UnknownField *this_local;
  
  local_18 = output;
  output_local = (CodedOutputStream *)this;
  TVar2 = type(this);
  local_51 = 0;
  if (TVar2 != TYPE_LENGTH_DELIMITED) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.cc"
               ,0x145);
    local_51 = 1;
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (TYPE_LENGTH_DELIMITED) == (type()): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&data + 3),other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  pCVar1 = local_18;
  value = std::__cxx11::string::size();
  io::CodedOutputStream::WriteVarint32(pCVar1,value);
  pCVar1 = local_18;
  data_00 = (void *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  io::CodedOutputStream::WriteRawMaybeAliased(pCVar1,data_00,size);
  return;
}

Assistant:

void UnknownField::SerializeLengthDelimitedNoTag(
    io::CodedOutputStream* output) const {
  GOOGLE_DCHECK_EQ(TYPE_LENGTH_DELIMITED, type());
  const string& data = *data_.length_delimited_.string_value_;
  output->WriteVarint32(data.size());
  output->WriteRawMaybeAliased(data.data(), data.size());
}